

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O3

void __thiscall
TPZSparseBlockDiagonal<float>::Print
          (TPZSparseBlockDiagonal<float> *this,char *message,ostream *out,MatrixOutputFormat format)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  char cVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  TPZBlockDiagonal<float>::Print(&this->super_TPZBlockDiagonal<float>,message,out,format);
  if (format == EFormatted) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"Equations for each block ",0x19);
    cVar4 = (char)out;
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    lVar1 = (this->fBlockIndex).fNElements;
    if (1 < lVar1) {
      lVar7 = 0;
      do {
        plVar2 = (this->fBlockIndex).fStore;
        lVar6 = plVar2[lVar7];
        lVar3 = plVar2[lVar7 + 1];
        std::__ostream_insert<char,std::char_traits<char>>(out,"Block ",6);
        poVar5 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
        if (lVar6 < lVar3) {
          do {
            poVar5 = std::ostream::_M_insert<long>((long)out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            lVar6 = lVar6 + 1;
          } while (lVar3 != lVar6);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        bVar8 = lVar7 != lVar1 + -2;
        lVar7 = lVar7 + 1;
      } while (bVar8);
    }
  }
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::Print(const char* message, std::ostream& out, const MatrixOutputFormat format) const
{
	TPZBlockDiagonal<TVar>::Print(message, out, format);
	if(format == EFormatted)
	{
		out << "Equations for each block " << endl;
		int64_t nbl = fBlockIndex.NElements()-1;
		int64_t ibl;
		for(ibl = 0; ibl<nbl ; ibl++)
		{
			int64_t first = fBlockIndex[ibl];
			int64_t last = fBlockIndex[ibl+1];
			out << "Block " << ibl << " : ";
			int64_t i;
			for(i=first; i<last; i++) out << fBlock[i] << " ";
			out << endl;
		}
	}
}